

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::LogBuilder::convertToColoredOutput(LogBuilder *this,string_t *logLine,Level level)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char *local_28;
  char_t *resetColor;
  string_t *psStack_18;
  Level level_local;
  string_t *logLine_local;
  LogBuilder *this_local;
  
  if ((base::utils::s_termSupportsColor & 1) != 0) {
    local_28 = "\x1b[0m";
    resetColor._6_2_ = level;
    psStack_18 = logLine;
    logLine_local = (string_t *)this;
    if ((level == Error) || (level == Fatal)) {
      std::operator+(&local_68,"\x1b[31m",logLine);
      std::operator+(&local_48,&local_68,local_28);
      std::__cxx11::string::operator=((string *)psStack_18,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
    }
    else if (level == Warning) {
      std::operator+(&local_b8,"\x1b[33m",logLine);
      std::operator+(&local_98,&local_b8,local_28);
      std::__cxx11::string::operator=((string *)psStack_18,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
    }
  }
  return;
}

Assistant:

void convertToColoredOutput(base::type::string_t* logLine, Level level) {
        if (!base::utils::s_termSupportsColor) return;
        const base::type::char_t* resetColor = ELPP_LITERAL("\x1b[0m");
        if (level == Level::Error || level == Level::Fatal)
            *logLine = ELPP_LITERAL("\x1b[31m") + *logLine + resetColor;
        else if (level == Level::Warning)
            *logLine = ELPP_LITERAL("\x1b[33m") + *logLine + resetColor;
    }